

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer_holder.hpp
# Opt level: O1

void * __thiscall
boost::python::objects::
pointer_holder<std::unique_ptr<LFPConsumer_python,_std::default_delete<LFPConsumer_python>_>,_LFPConsumer_python>
::holds(pointer_holder<std::unique_ptr<LFPConsumer_python,_std::default_delete<LFPConsumer_python>_>,_LFPConsumer_python>
        *this,type_info dst_t,bool null_ptr_only)

{
  int iVar1;
  void *pvVar2;
  LFPConsumer_python *pLVar3;
  
  iVar1 = strcmp(dst_t.m_base_type,"St10unique_ptrI18LFPConsumer_pythonSt14default_deleteIS0_EE");
  if ((iVar1 != 0) ||
     ((null_ptr_only &&
      ((this->m_p)._M_t.
       super___uniq_ptr_impl<LFPConsumer_python,_std::default_delete<LFPConsumer_python>_>._M_t.
       super__Tuple_impl<0UL,_LFPConsumer_python_*,_std::default_delete<LFPConsumer_python>_>.
       super__Head_base<0UL,_LFPConsumer_python_*,_false>._M_head_impl != (LFPConsumer_python *)0x0)
      ))) {
    pLVar3 = (this->m_p)._M_t.
             super___uniq_ptr_impl<LFPConsumer_python,_std::default_delete<LFPConsumer_python>_>.
             _M_t.
             super__Tuple_impl<0UL,_LFPConsumer_python_*,_std::default_delete<LFPConsumer_python>_>.
             super__Head_base<0UL,_LFPConsumer_python_*,_false>._M_head_impl;
    if (pLVar3 == (LFPConsumer_python *)0x0) {
      pLVar3 = (LFPConsumer_python *)0x0;
    }
    else {
      iVar1 = strcmp("18LFPConsumer_python",dst_t.m_base_type);
      if (iVar1 != 0) {
        pvVar2 = (void *)find_dynamic_type(pLVar3,(type_info)"18LFPConsumer_python",dst_t);
        return pvVar2;
      }
    }
  }
  else {
    pLVar3 = (LFPConsumer_python *)&this->m_p;
  }
  return pLVar3;
}

Assistant:

void* pointer_holder<Pointer, Value>::holds(type_info dst_t, bool null_ptr_only)
{
    typedef typename boost::python::detail::remove_const< Value >::type non_const_value;

    if (dst_t == python::type_id<Pointer>()
        && !(null_ptr_only && get_pointer(this->m_p))
    )
        return &this->m_p;

    Value* p0
#  if BOOST_WORKAROUND(__SUNPRO_CC, BOOST_TESTED_AT(0x590))
        = static_cast<Value*>( get_pointer(this->m_p) )
#  else 
        = get_pointer(this->m_p)
#  endif
        ;
    non_const_value* p = const_cast<non_const_value*>( p0 );

    if (p == 0)
        return 0;
    
    if (void* wrapped = holds_wrapped(dst_t, p, p))
        return wrapped;
    
    type_info src_t = python::type_id<non_const_value>();
    return src_t == dst_t ? p : find_dynamic_type(p, src_t, dst_t);
}